

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

void __thiscall vm::VM::VM(VM *this,File *file)

{
  File::File(&this->_file,file);
  (this->_heapRecord).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_heapRecord).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_stack)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (int *)0x0;
  (this->_heap)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (int *)0x0;
  (this->_heapRecord).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_contexts).super__Vector_base<vm::VM::Context,_std::allocator<vm::VM::Context>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_contexts).super__Vector_base<vm::VM::Context,_std::allocator<vm::VM::Context>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_contexts).super__Vector_base<vm::VM::Context,_std::allocator<vm::VM::Context>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_currentInstructions).super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_currentInstructions).super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_currentInstructions).super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_stringLiteralPool)._M_h._M_buckets = &(this->_stringLiteralPool)._M_h._M_single_bucket;
  (this->_stringLiteralPool)._M_h._M_bucket_count = 1;
  (this->_stringLiteralPool)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_stringLiteralPool)._M_h._M_element_count = 0;
  (this->_stringLiteralPool)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->_stringLiteralPool)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_stringLiteralPool)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  init(this,(EVP_PKEY_CTX *)file);
  return;
}

Assistant:

VM::VM(File file) noexcept : _file(std::move(file)){
    init();
}